

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O2

void filemgr_add_stale_block(filemgr *file,bid_t pos,size_t len)

{
  list *list;
  list_elem *plVar1;
  bid_t *pbVar2;
  
  list = file->stale_list;
  if (list != (list *)0x0) {
    plVar1 = list->tail;
    if ((plVar1 == (list_elem *)0x0) ||
       ((long)&(plVar1[-1].prev)->prev + (ulong)*(uint *)&plVar1[-1].next != pos)) {
      pbVar2 = (bid_t *)calloc(1,0x28);
      *pbVar2 = pos;
      *(int *)(pbVar2 + 1) = (int)len;
      list_push_back(list,(list_elem *)(pbVar2 + 2));
      return;
    }
    *(uint *)&plVar1[-1].next = (int)len + *(uint *)&plVar1[-1].next;
  }
  return;
}

Assistant:

void filemgr_add_stale_block(struct filemgr *file,
                             bid_t pos,
                             size_t len)
{
    if (file->stale_list) {
        struct stale_data *item;
        struct list_elem *e;

        e = list_end(file->stale_list);

        if (e) {
            item = _get_entry(e, struct stale_data, le);
            if (item->pos + item->len == pos) {
                // merge if consecutive item
                item->len += len;
                return;
            }
        }

        item = (struct stale_data*)calloc(1, sizeof(struct stale_data));
        item->pos = pos;
        item->len = len;
        list_push_back(file->stale_list, &item->le);
    }
}